

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

nodetest_t __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_node_test_type
          (xpath_parser *this,xpath_lexer_string *name)

{
  char cVar1;
  bool bVar2;
  
  cVar1 = *(char *)&this->_alloc->_root;
  if (cVar1 == 't') {
    bVar2 = xpath_lexer_string::operator==((xpath_lexer_string *)this,(char_t *)"text");
    if (bVar2) {
      return nodetest_type_text;
    }
  }
  else if (cVar1 == 'n') {
    bVar2 = xpath_lexer_string::operator==((xpath_lexer_string *)this,(char_t *)"node");
    if (bVar2) {
      return nodetest_type_node;
    }
  }
  else if (cVar1 == 'p') {
    bVar2 = xpath_lexer_string::operator==
                      ((xpath_lexer_string *)this,(char_t *)"processing-instruction");
    if (bVar2) {
      return nodetest_type_pi;
    }
  }
  else if ((cVar1 == 'c') &&
          (bVar2 = xpath_lexer_string::operator==((xpath_lexer_string *)this,"comment"), bVar2)) {
    return nodetest_type_comment;
  }
  return nodetest_none;
}

Assistant:

nodetest_t parse_node_test_type(const xpath_lexer_string& name)
		{
			switch (name.begin[0])
			{
			case 'c':
				if (name == PUGIXML_TEXT("comment"))
					return nodetest_type_comment;

				break;

			case 'n':
				if (name == PUGIXML_TEXT("node"))
					return nodetest_type_node;

				break;

			case 'p':
				if (name == PUGIXML_TEXT("processing-instruction"))
					return nodetest_type_pi;

				break;

			case 't':
				if (name == PUGIXML_TEXT("text"))
					return nodetest_type_text;

				break;

			default:
				break;
			}

			return nodetest_none;
		}